

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generateFissionYields.hpp
# Opt level: O3

vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
* njoy::ENDFtk::section::Type<8,_454>::generateFissionYields
            (vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
             *__return_storage_ptr__,
            vector<unsigned_int,_std::allocator<unsigned_int>_> *identifiers,
            vector<unsigned_int,_std::allocator<unsigned_int>_> *states,
            vector<double,_std::allocator<double>_> *energies,
            vector<unsigned_int,_std::allocator<unsigned_int>_> *interpolants,
            vector<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
            *yields)

{
  pointer pvVar1;
  pointer pdVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong __n;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint args_1;
  ulong uVar10;
  ulong local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  fn<meta::id<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>
  local_48 [8];
  vector<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
  *local_40;
  int local_38;
  undefined1 local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  args_1 = (uint)uVar10;
  __n = uVar10 & 0xffffffff;
  std::
  vector<njoy::ENDFtk::section::FissionYieldData,_std::allocator<njoy::ENDFtk::section::FissionYieldData>_>
  ::reserve(__return_storage_ptr__,__n);
  if (__n != ((long)(interpolants->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(interpolants->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 2) + 1U) {
    tools::Log::error<char_const*>
              ("Encountered inconsistent number of energy values and interpolation flags");
    tools::Log::info<char_const*>("Number of I values must be equal to NE - 1");
    tools::Log::info<char_const*,unsigned_long>
              ("Number of I values: {}",
               (long)(interpolants->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(interpolants->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 2);
    tools::Log::info<char_const*,unsigned_int>("NE value: {}",args_1);
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = getenv;
    __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
  }
  uVar5 = (long)(identifiers->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(identifiers->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)uVar5 >> 2;
  uVar7 = uVar4 & 0xffffffff;
  if ((uVar7 == (long)(states->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(states->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 2) &&
     (pvVar1 = (yields->
               super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
     uVar7 == ((long)(yields->
                     super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555)) {
    if ((int)(uVar5 >> 2) != 0) {
      lVar9 = 8;
      uVar5 = 0;
      do {
        if (*(long *)((long)&(pvVar1->
                             super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                             )._M_impl.super__Vector_impl_data + lVar9) -
            *(long *)((long)pvVar1 + lVar9 + -8) >> 4 != __n) {
          tools::Log::error<char_const*,unsigned_int>
                    ("The number of fission yield values for the fission product with index {} is not equal to the expected value"
                     ,(uint)uVar5);
          tools::Log::info<char_const*,unsigned_int>("NE value: {}",args_1);
          pvVar1 = (yields->
                   super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          tools::Log::info<char_const*,unsigned_long>
                    ("yields[i].size(): {}",
                     *(long *)((long)&(pvVar1->
                                      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                      )._M_impl.super__Vector_impl_data + lVar9) -
                     *(long *)((long)pvVar1 + lVar9 + -8) >> 4);
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = getenv;
          __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
        }
        uVar5 = uVar5 + 1;
        lVar9 = lVar9 + 0x18;
      } while ((uVar4 & 0xffffffff) != uVar5);
    }
    if (args_1 != 0) {
      lVar8 = -2;
      iVar6 = 0;
      lVar9 = 0;
      do {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_90,identifiers);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_60,states);
        local_34 = 1;
        local_40 = yields;
        local_38 = iVar6;
        ranges::detail::to_container::
        fn<meta::id<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>::
        impl<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,ranges::basic_iterator<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>*,std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>>,ranges::iter_transform_view<ranges::ref_view<std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>>,ranges::indirected<njoy::ENDFtk::section::Type<8,454>::generateFissionYields(std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<double,std::allocator<double>>&&,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>&&)::_lambda(auto:1_const&)_1_>>::adaptor<false>>>,ranges::transform_view<ranges::ref_view<std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>>,njoy::ENDFtk::section::Type<8,454>::generateFissionYields(std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<double,std::allocator<double>>&&,std::vector<unsigned_int,std::allocator<unsigned_int>>&&,std::vector<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,std::allocator<std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>>>&&)::_lambda(auto:1_const&)_1_>>
                  (&local_78,local_48);
        pdVar2 = (energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (lVar8 == -2) {
          local_98 = ((long)(energies->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3) - 1;
        }
        else {
          local_98 = (ulong)*(uint *)((long)(interpolants->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar8 * 2);
        }
        std::
        vector<njoy::ENDFtk::section::FissionYieldData,std::allocator<njoy::ENDFtk::section::FissionYieldData>>
        ::
        emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>,double&,unsigned_long>
                  ((vector<njoy::ENDFtk::section::FissionYieldData,std::allocator<njoy::ENDFtk::section::FissionYieldData>>
                    *)__return_storage_ptr__,&local_90,&local_60,&local_78,
                   (double *)((long)pdVar2 + lVar9),&local_98);
        if (local_78.
            super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_90.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        lVar8 = lVar8 + 2;
        lVar9 = lVar9 + 8;
        iVar6 = iVar6 + 1;
      } while ((uVar10 & 0xffffffff) << 3 != lVar9);
    }
    return __return_storage_ptr__;
  }
  tools::Log::error<char_const*>
            ("Encountered inconsistent number of identifiers, isomeric states and yield data");
  tools::Log::info<char_const*>
            ("Number of identifiers, isomeric states and yield sets must be the same");
  tools::Log::info<char_const*,unsigned_long>
            ("Number of identifiers: {}",
             (long)(identifiers->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(identifiers->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2);
  tools::Log::info<char_const*,unsigned_long>
            ("Number of isomeric states: {}",
             (long)(states->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(states->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 2);
  tools::Log::info<char_const*,unsigned_long>
            ("Number of yield sets: {}",
             ((long)(yields->
                    super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(yields->
                    super__Vector_base<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>,_std::allocator<std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = getenv;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static std::vector< FissionYieldData >
generateFissionYields( std::vector< unsigned int >&& identifiers,
                       std::vector< unsigned int >&& states,
                       std::vector< double >&& energies,
                       std::vector< unsigned int >&& interpolants,
                       std::vector< std::vector< std::array< double, 2 > > >&& yields ) {

  std::vector< FissionYieldData > sequence;
  unsigned int size = energies.size();
  sequence.reserve( size );

  if ( size != interpolants.size() + 1 ) {

    Log::error( "Encountered inconsistent number of energy values and "
                "interpolation flags" );
    Log::info( "Number of I values must be equal to NE - 1" );
    Log::info( "Number of I values: {}", interpolants.size() );
    Log::info( "NE value: {}", size );
    throw std::exception();
  }

  unsigned int nfp = identifiers.size();
  if ( ( nfp != states.size() ) || ( nfp != yields.size() ) ) {

    Log::error( "Encountered inconsistent number of identifiers, isomeric states "
                "and yield data" );
    Log::info( "Number of identifiers, isomeric states and yield sets must be the same" );
    Log::info( "Number of identifiers: {}", identifiers.size() );
    Log::info( "Number of isomeric states: {}", states.size() );
    Log::info( "Number of yield sets: {}", yields.size() );
    throw std::exception();
  }

  for ( unsigned int i = 0; i < nfp; ++i ) {

    if ( yields[i].size() != size ) {

      Log::error( "The number of fission yield values for the fission product "
                 "with index {} is not equal to the expected value", i );
      Log::info( "NE value: {}", size );
      Log::info( "yields[i].size(): {}", yields[i].size() );
      throw std::exception();
    }
  }

  for ( unsigned int i = 0; i < size; ++i ) {

    sequence.emplace_back( std::vector< unsigned int >( identifiers ),
                           std::vector< unsigned int >( states ),
                           ranges::to< std::vector< std::array< double, 2 > > >(
                               yields | ranges::cpp20::views::transform(
                                            [i] ( const auto& range )
                                                { return range[i]; } ) ),
                           energies[i],
                           i == 0 ? energies.size() - 1 : interpolants[i-1] );
  }

  return sequence;
}